

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O2

EulerAngles *
AML::converEulerAnglesZXZtoXYZ
          (EulerAngles *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double __x;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  __x = cos(theta);
  dVar3 = sin(theta);
  dVar4 = cos(psi);
  dVar5 = sin(psi);
  dVar6 = atan2(dVar1 * dVar3,__x);
  dVar3 = asin(dVar3 * dVar2);
  dVar1 = atan2(dVar1 * dVar5 + dVar2 * __x * dVar4,dVar1 * dVar4 - dVar2 * __x * dVar5);
  __return_storage_ptr__->phi = dVar6;
  __return_storage_ptr__->theta = -dVar3;
  __return_storage_ptr__->psi = dVar1;
  __return_storage_ptr__->seq_ = XYZ;
  return __return_storage_ptr__;
}

Assistant:

EulerAngles converEulerAnglesZXZtoXYZ(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double cosPsi = cos(psi);
        const double sinPsi = sin(psi);
        const double phiXYZ = atan2(cosPhi * sinTheta, cosTheta);
        const double thetaXYZ = -asin(sinPhi * sinTheta);
        const double psiXYZ =
            atan2(cosPhi * sinPsi + sinPhi * cosTheta * cosPsi, cosPhi * cosPsi - sinPhi * cosTheta * sinPsi);
        return EulerAngles(phiXYZ, thetaXYZ, psiXYZ, EulerAngles::EulerSequence::XYZ);
    }